

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  vec3 *v;
  tvec3<float,_(glm::precision)0> *up;
  float fVar4;
  ImVec4 IVar5;
  tvec3<float,_(glm::precision)0> tVar6;
  allocator<char> local_ad9;
  string local_ad8;
  undefined1 local_ab8 [28];
  col_type local_a9c;
  col_type local_a8c;
  undefined8 local_a7c;
  undefined8 uStack_a74;
  float local_a6c;
  undefined1 auStack_a68 [4];
  float angle;
  undefined8 uStack_a60;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_a58 [3];
  undefined1 auStack_a28 [8];
  mat4 model;
  uint i;
  allocator<char> local_9b9;
  string local_9b8;
  undefined8 local_998;
  float local_990;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_988;
  undefined1 local_978 [8];
  mat4 view;
  mat4 projection;
  allocator<char> local_8e9;
  float currentFrame;
  allocator<char> local_8c1;
  string local_8c0;
  stbi_uc *local_8a0;
  uchar *data;
  uint local_890;
  int nrChannels;
  int height;
  int width;
  uint texture2;
  uint texture1;
  uint VAO;
  uint VBO;
  vec3 cubePositions [10];
  undefined1 local_7f8 [8];
  float vertices [180];
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4e1;
  string local_4e0;
  undefined1 local_4c0 [8];
  Shader shader;
  ImVec4 clear_color;
  int nrAttributes;
  GLFWwindow *window;
  GLuint ID;
  bool show_another_window;
  char path [1024];
  char **param_1_local;
  int param_0_local;
  
  window._7_1_ = 1;
  path._1016_8_ = param_2;
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    param_1_local._4_4_ = 1;
  }
  else {
    glfwWindowHint(0x22002);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    register0x00000000 = (GLFWwindow *)glfwCreateWindow(800,600,"ImGui GLFW example 09",0);
    glfwMakeContextCurrent(register0x00000000);
    glfwSetFramebufferSizeCallback(stack0xfffffffffffffbd8,framebuffer_size_callback);
    glfwSetCursorPosCallback(stack0xfffffffffffffbd8,mouse_callback);
    glfwSetScrollCallback(stack0xfffffffffffffbd8,scroll_callback);
    glfwSetInputMode(stack0xfffffffffffffbd8,0x33001,0x34003);
    gl3wInit();
    (*gl3wEnable)(0xb71);
    (*gl3wGetIntegerv)(0x8869,(GLint *)&clear_color.z);
    poVar3 = std::operator<<((ostream *)&std::cout,"Maximum nr of vertex attributes supported: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)clear_color.z);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    ImGui_ImplGlfwGL3_Init(stack0xfffffffffffffbd8,true);
    ImColor::ImColor((ImColor *)&shader.pID,0x72,0x90,0x9a,0xff);
    IVar5 = ImColor::operator_cast_to_ImVec4((ImColor *)&shader.pID);
    clear_color._0_8_ = IVar5._8_8_;
    getcwd((char *)&ID,0x3ff);
    Shader::Shader((Shader *)local_4c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,(char *)&ID,&local_4e1);
    Shader::loadVS((Shader *)local_4c0,&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator(&local_4e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,(char *)&ID,&local_519);
    Shader::loadFS((Shader *)local_4c0,&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator(&local_519);
    Shader::build((Shader *)local_4c0);
    memcpy(local_7f8,&DAT_0017f2e0,0x2d0);
    cubePositions._104_8_ = 0xbfc000003f800000;
    cubePositions[7].field_0._4_8_ = 0x3e4ccccd3fc00000;
    cubePositions[8].field_0._0_8_ = 0xbfa66666bfc00000;
    cubePositions[6].field_0._0_8_ = 0x3fc00000c0200000;
    cubePositions._80_8_ = 0xc020000040000000;
    cubePositions._56_8_ = 0xc0f0000040400000;
    cubePositions[5].field_0._4_8_ = 0xc00000003fa66666;
    cubePositions[3].field_0._4_8_ = 0xbecccccd4019999a;
    cubePositions[4].field_0._0_8_ = 0xbfd9999ac0600000;
    cubePositions[2].field_0._0_8_ = 0xc0733333c0200000;
    cubePositions._32_8_ = 0xc144cccdc0000000;
    cubePositions._8_8_ = 0xc170000040a00000;
    cubePositions[1].field_0._4_8_ = 0xc00ccccdbfc00000;
    VAO = 0;
    VBO = 0;
    cubePositions[0].field_0.field_0.x = 0.0;
    cubePositions[0].field_0.field_0.y = 2.0;
    (*gl3wGenVertexArrays)(1,&texture2);
    (*gl3wGenBuffers)(1,&texture1);
    (*gl3wBindVertexArray)(texture2);
    (*gl3wBindBuffer)(0x8892,texture1);
    (*gl3wBufferData)(0x8892,0x2d0,local_7f8,0x88e4);
    (*gl3wVertexAttribPointer)(0,3,0x1406,'\0',0x14,(GLvoid *)0x0);
    (*gl3wEnableVertexAttribArray)(0);
    (*gl3wVertexAttribPointer)(1,2,0x1406,'\0',0x14,(GLvoid *)0xc);
    (*gl3wEnableVertexAttribArray)(1);
    (*gl3wGenTextures)(1,(GLuint *)&width);
    (*gl3wBindTexture)(0xde1,width);
    (*gl3wTexParameteri)(0xde1,0x2802,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2803,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2801,0x2601);
    (*gl3wTexParameteri)(0xde1,0x2800,0x2601);
    stbi_set_flip_vertically_on_load(1);
    getcwd((char *)&ID,0x3ff);
    strcat((char *)&ID,"/container.jpg");
    printf("path[%s]\n",&ID);
    local_8a0 = stbi_load((char *)&ID,&nrChannels,(int *)&local_890,(int *)((long)&data + 4),0);
    if (local_8a0 == (stbi_uc *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Failed to load texture");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      (*gl3wTexImage2D)(0xde1,0,0x1907,nrChannels,local_890,0,0x1907,0x1401,local_8a0);
      (*gl3wGenerateMipmap)(0xde1);
    }
    stbi_image_free(local_8a0);
    (*gl3wGenTextures)(1,(GLuint *)&height);
    (*gl3wBindTexture)(0xde1,height);
    (*gl3wTexParameteri)(0xde1,0x2802,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2803,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2801,0x2601);
    (*gl3wTexParameteri)(0xde1,0x2800,0x2601);
    getcwd((char *)&ID,0x3ff);
    strcat((char *)&ID,"/awesomeface.png");
    printf("path[%s]\n",&ID);
    up = (tvec3<float,_(glm::precision)0> *)0x0;
    local_8a0 = stbi_load((char *)&ID,&nrChannels,(int *)&local_890,(int *)((long)&data + 4),0);
    if (local_8a0 == (stbi_uc *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Failed to load texture");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      up = (tvec3<float,_(glm::precision)0> *)(ulong)local_890;
      (*gl3wTexImage2D)(0xde1,0,0x1907,nrChannels,local_890,0,0x1908,0x1401,local_8a0);
      (*gl3wGenerateMipmap)(0xde1);
    }
    stbi_image_free(local_8a0);
    Shader::use((Shader *)local_4c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"texture1",&local_8c1);
    Shader::setInt((Shader *)local_4c0,&local_8c0,0);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::allocator<char>::~allocator(&local_8c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&currentFrame,"texture2",&local_8e9);
    Shader::setInt((Shader *)local_4c0,(string *)&currentFrame,1);
    std::__cxx11::string::~string((string *)&currentFrame);
    std::allocator<char>::~allocator(&local_8e9);
    while (iVar2 = glfwWindowShouldClose(stack0xfffffffffffffbd8), iVar2 == 0) {
      dVar1 = (double)glfwGetTime();
      deltaTime = (float)dVar1 - lastFrame;
      lastFrame = (float)dVar1;
      processInput(stack0xfffffffffffffbd8);
      ImGui_ImplGlfwGL3_NewFrame();
      if ((window._7_1_ & 1) != 0) {
        ImVec2::ImVec2((ImVec2 *)((long)&projection.value[3].field_0 + 8),200.0,100.0);
        ImGui::SetNextWindowSize((ImVec2 *)((long)&projection.value[3].field_0 + 8),4);
        ImGui::Begin("Another Window",(bool *)((long)&window + 7),0);
        ShowAnotherWindow();
        ImGui::End();
      }
      (*gl3wClearColor)(0.2,0.3,0.3,1.0);
      (*gl3wClear)(0x4100);
      (*gl3wActiveTexture)(0x84c0);
      (*gl3wBindTexture)(0xde1,width);
      (*gl3wActiveTexture)(0x84c1);
      (*gl3wBindTexture)(0xde1,height);
      Shader::use((Shader *)local_4c0);
      fVar4 = glm::radians<float>(fov);
      glm::perspective<float>
                ((tmat4x4<float,_(glm::precision)0> *)((long)&view.value[3].field_0 + 8),fVar4,
                 1.3333334,0.1,100.0);
      tVar6 = glm::operator+(&cameraPos,&cameraFront);
      local_990 = tVar6.field_0._8_4_;
      local_998 = tVar6.field_0._0_8_;
      v = &cameraUp;
      local_988._0_8_ = local_998;
      local_988.field_0.z = local_990;
      glm::lookAt<float,(glm::precision)0>
                ((tmat4x4<float,_(glm::precision)0> *)local_978,(glm *)&cameraPos,
                 (tvec3<float,_(glm::precision)0> *)&local_988.field_0,&cameraUp,up);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9b8,"projection",&local_9b9);
      Shader::setMat4((Shader *)local_4c0,&local_9b8,(mat4 *)((long)&view.value[3].field_0 + 8));
      std::__cxx11::string::~string((string *)&local_9b8);
      std::allocator<char>::~allocator(&local_9b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i,"view",(allocator<char> *)(model.value[3].field_0.data.data + 0xf));
      Shader::setMat4((Shader *)local_4c0,(string *)&i,(mat4 *)local_978);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)(model.value[3].field_0.data.data + 0xf));
      (*gl3wBindVertexArray)(texture2);
      for (model.value[3].field_0.field_0.z = 0.0; (uint)model.value[3].field_0.field_0.z < 10;
          model.value[3].field_0.field_0.z = (float)((int)model.value[3].field_0.field_0.z + 1)) {
        glm::tmat4x4<float,_(glm::precision)0>::tmat4x4
                  ((tmat4x4<float,_(glm::precision)0> *)auStack_a28);
        glm::translate<float,(glm::precision)0>
                  ((tmat4x4<float,_(glm::precision)0> *)auStack_a68,(glm *)auStack_a28,
                   (tmat4x4<float,_(glm::precision)0> *)
                   (&VAO + (ulong)(uint)model.value[3].field_0.field_0.z * 3),v);
        model.value[0].field_0._8_8_ = local_a58[0]._0_8_;
        model.value[1].field_0._0_8_ = local_a58[0]._8_8_;
        auStack_a28 = (undefined1  [8])_auStack_a68;
        model.value[0].field_0._0_8_ = uStack_a60;
        local_a6c = (float)(uint)model.value[3].field_0.field_0.z * 20.0;
        if ((s1 != -1) && (model.value[3].field_0.field_0.z == (float)s1)) {
          dVar1 = (double)glfwGetTime();
          local_a6c = (float)(dVar1 * 25.0);
        }
        fVar4 = glm::radians<float>(local_a6c);
        glm::tvec3<float,_(glm::precision)0>::tvec3
                  ((tvec3<float,_(glm::precision)0> *)local_ab8,1.0,0.3,0.5);
        glm::rotate<float,(glm::precision)0>
                  ((tmat4x4<float,_(glm::precision)0> *)(local_ab8 + 0xc),(glm *)auStack_a28,
                   (tmat4x4<float,_(glm::precision)0> *)local_ab8,fVar4,v);
        model.value[2].field_0._8_8_ = local_a7c;
        model.value[3].field_0._0_8_ = uStack_a74;
        model.value[1].field_0._8_8_ = local_a8c.field_0._0_8_;
        model.value[2].field_0._0_8_ = local_a8c.field_0._8_8_;
        model.value[0].field_0._8_8_ = local_a9c.field_0._0_8_;
        model.value[1].field_0._0_8_ = local_a9c.field_0._8_8_;
        auStack_a28 = (undefined1  [8])local_ab8._12_8_;
        model.value[0].field_0._0_8_ = local_ab8._20_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad8,"model",&local_ad9);
        Shader::setMat4((Shader *)local_4c0,&local_ad8,(mat4 *)auStack_a28);
        std::__cxx11::string::~string((string *)&local_ad8);
        std::allocator<char>::~allocator(&local_ad9);
        (*gl3wDrawArrays)(4,0,0x24);
      }
      ImGui::Render();
      glfwSwapBuffers(stack0xfffffffffffffbd8);
      glfwPollEvents();
    }
    ImGui_ImplGlfwGL3_Shutdown();
    (*gl3wDeleteVertexArrays)(1,&texture2);
    (*gl3wDeleteBuffers)(1,&texture1);
    glfwTerminate();
    param_1_local._4_4_ = 0;
    Shader::~Shader((Shader *)local_4c0);
  }
  return param_1_local._4_4_;
}

Assistant:

int main(int, char**)
{
    // Setup window
    char path[1024];
    bool show_another_window = true;

    GLuint ID;
    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
      return 1;

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
#if __APPLE__
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
#endif
    GLFWwindow* window = glfwCreateWindow(SCR_WIDTH, SCR_HEIGHT, "ImGui GLFW example 09", NULL, NULL);
    glfwMakeContextCurrent(window);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
    glfwSetCursorPosCallback(window, mouse_callback);
    glfwSetScrollCallback(window, scroll_callback);

    // tell GLFW to capture our mouse
    glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);

    gl3wInit();
    glEnable(GL_DEPTH_TEST);

    int nrAttributes;
    glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &nrAttributes);
    std::cout << "Maximum nr of vertex attributes supported: " << nrAttributes << std::endl;

    // Setup ImGui binding
    ImGui_ImplGlfwGL3_Init(window, true);

    ImVec4 clear_color = ImColor(114, 144, 154);

    // ------------------------------------
    // vertex shader
    getcwd((char*)path,1023);
    Shader shader;
    shader.loadVS(path);
    shader.loadFS(path);
    shader.build();

    // set up vertex data (and buffer(s)) and configure vertex attributes
    // ------------------------------------------------------------------
    float vertices[] = {
        -0.5f, -0.5f, -0.5f,  0.0f, 0.0f,
         0.5f, -0.5f, -0.5f,  1.0f, 0.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
        -0.5f,  0.5f, -0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 0.0f,

        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
         0.5f, -0.5f,  0.5f,  1.0f, 0.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 1.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 1.0f,
        -0.5f,  0.5f,  0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,

        -0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
        -0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
        -0.5f,  0.5f,  0.5f,  1.0f, 0.0f,

         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
         0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
         0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
         0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,

        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
         0.5f, -0.5f, -0.5f,  1.0f, 1.0f,
         0.5f, -0.5f,  0.5f,  1.0f, 0.0f,
         0.5f, -0.5f,  0.5f,  1.0f, 0.0f,
        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,

        -0.5f,  0.5f, -0.5f,  0.0f, 1.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
        -0.5f,  0.5f,  0.5f,  0.0f, 0.0f,
        -0.5f,  0.5f, -0.5f,  0.0f, 1.0f
    };
    // world space positions of our cubes
    glm::vec3 cubePositions[] = {
        glm::vec3( 0.0f,  0.0f,  0.0f),
        glm::vec3( 2.0f,  5.0f, -15.0f),
        glm::vec3(-1.5f, -2.2f, -2.5f),
        glm::vec3(-3.8f, -2.0f, -12.3f),
        glm::vec3( 2.4f, -0.4f, -3.5f),
        glm::vec3(-1.7f,  3.0f, -7.5f),
        glm::vec3( 1.3f, -2.0f, -2.5f),
        glm::vec3( 1.5f,  2.0f, -2.5f),
        glm::vec3( 1.5f,  0.2f, -1.5f),
        glm::vec3(-1.3f,  1.0f, -1.5f)
    };
    unsigned int VBO, VAO;
    glGenVertexArrays(1, &VAO);
    glGenBuffers(1, &VBO);

    glBindVertexArray(VAO);

    glBindBuffer(GL_ARRAY_BUFFER, VBO);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    // position attribute
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 5 * sizeof(float), (void*)0);
    glEnableVertexAttribArray(0);
    // texture coord attribute
    glVertexAttribPointer(1, 2, GL_FLOAT, GL_FALSE, 5 * sizeof(float), (void*)(3 * sizeof(float)));
    glEnableVertexAttribArray(1);


    // load and create a texture
    // -------------------------
    unsigned int texture1, texture2;
    // texture 1
    // ---------
    glGenTextures(1, &texture1);
    glBindTexture(GL_TEXTURE_2D, texture1);
    // set the texture wrapping parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    // set texture filtering parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    // load image, create texture and generate mipmaps
    int width, height, nrChannels;
    stbi_set_flip_vertically_on_load(true); // tell stb_image.h to flip loaded texture's on the y-axis.


    getcwd((char*)path,1023);
    strcat((char*)path,"/container.jpg");
    printf("path[%s]\n",(char*)path);
    unsigned char *data = stbi_load((char*)path, &width, &height, &nrChannels, 0);
    if (data){
      glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, GL_RGB, GL_UNSIGNED_BYTE, data);
      glGenerateMipmap(GL_TEXTURE_2D);
    }
    else{
        std::cout << "Failed to load texture" << std::endl;
    }
    stbi_image_free(data);
    // texture 2
    // ---------
    glGenTextures(1, &texture2);
    glBindTexture(GL_TEXTURE_2D, texture2);
    // set the texture wrapping parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    // set texture filtering parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    // load image, create texture and generate mipmaps
    getcwd((char*)path,1023);
    strcat((char*)path,"/awesomeface.png");
    printf("path[%s]\n",(char*)path);
    data = stbi_load((char*)path, &width, &height, &nrChannels, 0);
    if (data){
        // note that the awesomeface.png has transparency and thus an alpha channel, so make sure to tell OpenGL the data type is of GL_RGBA
        glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, data);
        glGenerateMipmap(GL_TEXTURE_2D);
    }
    else{
        std::cout << "Failed to load texture" << std::endl;
    }
    stbi_image_free(data);

    shader.use();
    shader.setInt("texture1", 0);
    shader.setInt("texture2", 1);
    //// END VERTEX
    while (!glfwWindowShouldClose(window)){

        float currentFrame = glfwGetTime();
        deltaTime = currentFrame - lastFrame;
        lastFrame = currentFrame;
        processInput(window);

        ImGui_ImplGlfwGL3_NewFrame();
        // 1. Show a simple window
        if (show_another_window){
            ImGui::SetNextWindowSize(ImVec2(200,100), ImGuiSetCond_FirstUseEver);
            ImGui::Begin("Another Window", &show_another_window);
            ShowAnotherWindow();
            ImGui::End();
        }
        // render
        // ------
        glClearColor(0.2f, 0.3f, 0.3f, 1.0f);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT); // also clear the depth buffer now!

         // bind textures on corresponding texture units
        glActiveTexture(GL_TEXTURE0);
        glBindTexture(GL_TEXTURE_2D, texture1);
        glActiveTexture(GL_TEXTURE1);
        glBindTexture(GL_TEXTURE_2D, texture2);

        // activate shader
        shader.use();

        // create transformations
        glm::mat4 projection = glm::perspective(glm::radians(fov), (float)SCR_WIDTH / (float)SCR_HEIGHT, 0.1f, 100.0f);
        glm::mat4 view = glm::lookAt(cameraPos, cameraPos + cameraFront, cameraUp);
        shader.setMat4("projection", projection);
        shader.setMat4("view", view);

        // render boxes
        glBindVertexArray(VAO);
        for (unsigned int i = 0; i < 10; i++)
        {
            // calculate the model matrix for each object and pass it to shader before drawing
            glm::mat4 model;
            model = glm::translate(model, cubePositions[i]);
            float angle = 20.0f * i;
            //model = glm::rotate(model, glm::radians(angle), glm::vec3(1.0f, 0.3f, 0.5f));
            //model = glm::rotate(model, (float)glfwGetTime() * glm::radians(50.0f), glm::vec3(0.5f, 1.0f, 0.0f));
            //glUniformMatrix4fv(glGetUniformLocation(shader.getpID(), "model"), 1, GL_FALSE, &model[0][0]);
            if(s1!=-1){  // every 3rd iteration (including the first) we set the angle using GLFW's time function.
              if(i==s1)
                angle = glfwGetTime() * 25.0f;
            }
            model = glm::rotate(model, glm::radians(angle), glm::vec3(1.0f, 0.3f, 0.5f));
            shader.setMat4("model", model);
            glDrawArrays(GL_TRIANGLES, 0, 36);
        }

        ImGui::Render();
        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    // Cleanup
    ImGui_ImplGlfwGL3_Shutdown();

    glDeleteVertexArrays(1, &VAO);
    glDeleteBuffers(1, &VBO);

    glfwTerminate();
    return 0;
}